

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utils.cpp
# Opt level: O2

char * glTextureWrapModeStr(int wrapMode)

{
  if (wrapMode == 0x2901) {
    return "repeat";
  }
  if (wrapMode == 0x8370) {
    return "mirrored repeat";
  }
  if (wrapMode == 0x812f) {
    return "clamp to edge";
  }
  if (wrapMode == 0x812d) {
    return "clamp to border";
  }
  __assert_fail("false",
                "/workspace/llm4binary/github/license_all_cmakelists_25/tuket[P]gltf_viewer/src/utils.cpp"
                ,0xfb,"const char *glTextureWrapModeStr(int)");
}

Assistant:

const char* glTextureWrapModeStr(int wrapMode)
{
    switch (wrapMode) {
        case GL_CLAMP_TO_EDGE: return "clamp to edge";
        case GL_CLAMP_TO_BORDER: return "clamp to border";
        case GL_MIRRORED_REPEAT: return "mirrored repeat";
        case GL_REPEAT: return "repeat";
        //case GL_MIRROR_CLAMP_TO_EDGE: return "mirror clamp to edge";
    }
    assert(false);
    return "";
}